

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

int parse_args_TEXLD(Context *ctx)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  int retval;
  
  bVar1 = ctx->major_ver;
  if (bVar1 < 2) {
    bVar4 = 0;
    if (ctx->minor_ver != 0xff) {
      bVar4 = ctx->minor_ver;
    }
    iVar2 = parse_destination_token(ctx,&ctx->dest_arg);
    iVar2 = iVar2 + 1;
    if (0x10003 < ((uint)bVar4 | (uint)bVar1 << 0x10)) {
      iVar3 = parse_source_token(ctx,ctx->source_args);
      iVar2 = iVar2 + iVar3;
    }
    return iVar2;
  }
  iVar2 = parse_args_DSS(ctx);
  return iVar2;
}

Assistant:

static int parse_args_TEXLD(Context *ctx)
{
    // different registers in px_1_3, ps_1_4, and ps_2_0!
    if (shader_version_atleast(ctx, 2, 0))
        return parse_args_DSS(ctx);
    else if (shader_version_atleast(ctx, 1, 4))
        return parse_args_DS(ctx);
    return parse_args_D(ctx);
}